

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# czsurface.c
# Opt level: O1

czsurface_blit_status czsurface_blit(czsurface *src,czsurface *dst,czpoint dstpoint)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *__dest;
  uchar *__src;
  uint uVar5;
  
  if (src->height != 0) {
    iVar1 = dst->width;
    iVar2 = dst->bpp;
    iVar3 = src->bpp;
    iVar4 = src->width;
    __dest = dst->pixels + (dstpoint.x + dstpoint.y * iVar1) * iVar2;
    __src = src->pixels;
    uVar5 = 0;
    do {
      memcpy(__dest,__src,(ulong)(uint)(src->width * dst->bpp));
      __dest = __dest + iVar1 * iVar2;
      __src = __src + (long)iVar4 * (long)iVar3;
      uVar5 = uVar5 + 1;
    } while (uVar5 < (uint)src->height);
  }
  return CZSURFACE_BLIT_OK;
}

Assistant:

czsurface_blit_status czsurface_blit(czsurface * src, czsurface * dst, czpoint dstpoint) {
    czsurface_internal_blit(src, dst, dstpoint);
    return CZSURFACE_BLIT_OK;
}